

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

transformation_t *
opengv::point_cloud::optimize_nonlinear
          (transformation_t *__return_storage_ptr__,PointCloudAdapterBase *adapter,Indices *indices)

{
  VectorXd x;
  int n;
  cayley_t local_278;
  rotation_t local_260;
  Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> local_218;
  NumericalDiff<opengv::point_cloud::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>
  local_1e8;
  Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> local_1c8;
  undefined1 local_198 [48];
  double *pdStack_168;
  double dStack_160;
  double *pdStack_158;
  Index local_150;
  double *pdStack_148;
  Index IStack_140;
  double *pdStack_138;
  Index IStack_130;
  Index IStack_128;
  int *piStack_120;
  Index IStack_118;
  Index local_110;
  undefined1 uStack_108;
  undefined7 uStack_107;
  undefined1 uStack_100;
  undefined7 uStack_ff;
  undefined1 uStack_f8;
  undefined7 uStack_f7;
  undefined1 uStack_f0;
  undefined8 uStack_ef;
  NumericalDiff<opengv::point_cloud::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>
  *local_e0;
  double *local_c8;
  Index IStack_c0;
  double *pdStack_b8;
  Index IStack_b0;
  double *pdStack_a8;
  Index IStack_a0;
  double *pdStack_98;
  Index IStack_90;
  
  n = 6;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&x,&n);
  (*adapter->_vptr_PointCloudAdapterBase[6])(&local_260,adapter);
  local_198._0_8_ =
       x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_198._24_8_ = 0;
  local_198._16_8_ = &x;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)local_198,
             (Matrix<double,_3,_1,_0,_3,_1> *)&local_260);
  (*adapter->_vptr_PointCloudAdapterBase[8])(local_198,adapter);
  math::rot2cayley((cayley_t *)&local_218,(rotation_t *)local_198);
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               3);
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       1.48219693752374e-323;
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       (double)x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)&x;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)&local_260,
             (Matrix<double,_3,_1,_0,_3,_1> *)&local_218);
  local_1e8.super_OptimizeNonlinearFunctor1.super_OptimizationFunctor<double,__1,__1>.m_values =
       (int)indices->_numberCorrespondences;
  local_e0 = &local_1e8;
  IStack_128 = 0;
  piStack_120 = (int *)0x0;
  IStack_118 = 0;
  pdStack_168 = (double *)0x0;
  dStack_160 = 0.0;
  pdStack_158 = (double *)0x0;
  local_150 = 0;
  pdStack_148 = (double *)0x0;
  IStack_140 = 0;
  pdStack_138 = (double *)0x0;
  IStack_130 = 0;
  local_110 = 0;
  uStack_108 = 0;
  uStack_107 = 0;
  uStack_100 = 0;
  uStack_ff = 0;
  uStack_f8 = 0;
  uStack_f7 = 0;
  uStack_f0 = 0;
  uStack_ef = 0;
  local_1e8.super_OptimizeNonlinearFunctor1.super_OptimizationFunctor<double,__1,__1>.m_inputs = 6;
  local_c8 = (double *)0x0;
  IStack_c0 = 0;
  pdStack_b8 = (double *)0x0;
  IStack_b0 = 0;
  pdStack_a8 = (double *)0x0;
  IStack_a0 = 0;
  pdStack_98 = (double *)0x0;
  IStack_90 = 0;
  local_198._32_16_ = ZEXT416(0) << 0x40;
  local_1e8.epsfcn = 0.0;
  local_198._0_8_ = (PointerType)0x4059000000000000;
  local_198._16_8_ = (XprTypeNested)0x3ec2a05f20000000;
  local_198._24_8_ = 0x3ec2a05f20000000;
  local_198._8_8_ = 4.94065645841247e-321;
  local_1e8.super_OptimizeNonlinearFunctor1._adapter = adapter;
  local_1e8.super_OptimizeNonlinearFunctor1._indices = indices;
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::point_cloud::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
  ::minimize((LevenbergMarquardt<Eigen::NumericalDiff<opengv::point_cloud::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
              *)local_198,(FVectorType *)&x);
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       (double)x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_218.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_0>.m_data =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
       m_storage.m_data.array + 9;
  local_218.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_startRow.m_value =
       0;
  local_218.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_startCol.m_value =
       3;
  local_218.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_outerStride = 3;
  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)&x;
  local_218.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_xpr =
       __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>>
            (&local_218,(Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)&local_260);
  local_218.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_0>.m_data =
       x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3;
  local_218.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_startRow.m_value =
       3;
  local_218.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_outerStride =
       x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_218.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_xpr =
       (XprTypeNested)&x;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_278,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_218);
  math::cayley2rot(&local_260,&local_278);
  local_1c8.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_1c8.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_1c8.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false,_true>.m_outerStride = 3;
  local_1c8.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>,_0>.m_data =
       (PointerType)__return_storage_ptr__;
  local_1c8.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false,_true>.m_xpr =
       __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>,Eigen::Matrix<double,3,3,0,3,3>>
            (&local_1c8,&local_260);
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::point_cloud::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
  ::~LevenbergMarquardt
            ((LevenbergMarquardt<Eigen::NumericalDiff<opengv::point_cloud::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
              *)local_198);
  Eigen::internal::handmade_aligned_free
            (x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

transformation_t optimize_nonlinear(
    PointCloudAdapterBase & adapter,
    const Indices & indices )
{
  const int n=6;
  VectorXd x(n);

  x.block<3,1>(0,0) = adapter.gett12();
  x.block<3,1>(3,0) = math::rot2cayley(adapter.getR12());

  OptimizeNonlinearFunctor1 functor( adapter, indices );
  NumericalDiff<OptimizeNonlinearFunctor1 > numDiff(functor);
  LevenbergMarquardt< NumericalDiff<OptimizeNonlinearFunctor1 > > lm(numDiff);

  lm.resetParameters();
  lm.parameters.ftol = 1.E10*NumTraits<double>::epsilon();
  lm.parameters.xtol = 1.E10*NumTraits<double>::epsilon();
  lm.parameters.maxfev = 1000;
  lm.minimize(x);

  transformation_t transformation;
  transformation.col(3) = x.block<3,1>(0,0);
  transformation.block<3,3>(0,0) = math::cayley2rot(x.block<3,1>(3,0));
  return transformation;
}